

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnqueueProcessedObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **list,
          void *objectAddress,uint index)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  byte *pbVar6;
  undefined8 *in_FS_OFFSET;
  
  uVar5 = GetAddressIndex(this,objectAddress);
  if (uVar5 != index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x658,"(GetAddressIndex(objectAddress) == index)",
                       "GetAddressIndex(objectAddress) == index");
    if (!bVar3) goto LAB_00229472;
    *puVar1 = 0;
  }
  if (index == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65a,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar3) goto LAB_00229472;
    *puVar1 = 0;
  }
  if (this->objectCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65b,"(this->objectCount != 1)","this->objectCount != 1");
    if (!bVar3) goto LAB_00229472;
    *puVar1 = 0;
  }
  if (&this->freeObjectList == list) {
    uVar5 = GetAddressBitIndex(objectAddress);
    BVar4 = BVStatic<2048UL>::TestAndSet(&this->debugFreeBits,(uint)uVar5);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x661,"(!isSet)","!isSet");
      if (!bVar3) {
LAB_00229472:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  FillFreeMemory(this,objectAddress,(ulong)this->objectSize);
  FreeObject::SetNext((FreeObject *)objectAddress,*list);
  *list = (FreeObject *)objectAddress;
  if ((Js::Configuration::Global[0x2c156] == '\x01') &&
     (Js::Configuration::Global[0x2057e] == '\x01')) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[4])(this,objectAddress);
  }
  pbVar6 = ObjectInfo(this,index);
  *pbVar6 = '\0';
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::EnqueueProcessedObject(FreeObject ** list, void* objectAddress, uint index)
{
    Assert(GetAddressIndex(objectAddress) == index);

    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
    Assert(this->objectCount != 1);

#if DBG || defined(RECYCLER_STATS)
    if (list == &this->freeObjectList)
    {
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(objectAddress));
        Assert(!isSet);
    }
#endif
    FillFreeMemory(objectAddress, objectSize);

    FreeObject * freeObject = (FreeObject *)objectAddress;
    freeObject->SetNext(*list);
    *list = freeObject;

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(RecyclerVerifyMark))
    {
        this->WBClearObject((char*)objectAddress);
    }
#endif

    // clear the attributes so that when we are allocating a leaf, we don't have to set the attribute
    this->ObjectInfo(index) = 0;
}